

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEditPrivate::updateCache(QDateTimeEditPrivate *this,QVariant *val,QString *str)

{
  bool bVar1;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  State *in_stack_00000008;
  State unusedState;
  int unused;
  QString copy;
  QVariant *in_stack_ffffffffffffffa8;
  QDateTime local_30 [8];
  undefined4 local_28;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::operator!=((QVariant *)in_RDI,in_stack_ffffffffffffffa8);
  if (!bVar1) {
    bVar1 = ::operator!=((QString *)in_RDI,(QString *)in_stack_ffffffffffffffa8);
    if ((!bVar1) && ((in_RDI[0x1c].super_QWidget.field_0x14 & 1) == 0)) goto LAB_00559d4d;
  }
  in_RDI[0x1c].super_QWidget.field_0x14 = 1;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffffa8);
  local_24 = QLineEdit::cursorPosition(in_RDI);
  local_28 = 0xaaaaaaaa;
  validateAndInterpret(this,(QString *)val,(int *)str,in_stack_00000008,(bool)unaff_retaddr);
  QDateTime::~QDateTime(local_30);
  in_RDI[0x1c].super_QWidget.field_0x14 = 0;
  QString::~QString((QString *)0x559d4d);
LAB_00559d4d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateCache(const QVariant &val, const QString &str) const
{
    if (val != cachedValue || str != cachedText || cacheGuard) {
        cacheGuard = true;
        QString copy = str;
        int unused = edit->cursorPosition();
        QValidator::State unusedState;
        validateAndInterpret(copy, unused, unusedState);
        cacheGuard = false;
    }
}